

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O2

int __thiscall xray_re::_lzhuf::GetByte(_lzhuf *this)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  FILE *in_RSI;
  
  bVar3 = this->getlen;
  while (bVar3 < 9) {
    iVar2 = getc(this,in_RSI);
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    this->getbuf = this->getbuf | iVar2 << (8 - this->getlen & 0x1f);
    bVar3 = this->getlen + 8;
    this->getlen = bVar3;
  }
  uVar1 = this->getbuf;
  this->getbuf = uVar1 << 8;
  this->getlen = bVar3 - 8;
  return uVar1 >> 8 & 0xff;
}

Assistant:

int _lzhuf::GetByte(void)	/* get one byte */
{
	unsigned i;

	while (getlen <= 8) {
		int c = getc();
		i = (c < 0) ? 0 : c;
		getbuf |= i << (8 - getlen);
		getlen += 8;
	}
	i = getbuf;
	getbuf <<= 8;
	getlen -= 8;
	return (i & 0xff00) >> 8;
}